

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall JsonArray_TooDeeplyNested_Test::TestBody(JsonArray_TooDeeplyNested_Test *this)

{
  bool bVar1;
  parser<json_out_callbacks> *this_00;
  error_code *lhs;
  char *message;
  error_code eVar2;
  AssertHelper local_170;
  Message local_168;
  error_code local_160;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  string local_138;
  result_type local_118;
  string local_e8;
  undefined1 local_c8 [8];
  parser<json_out_callbacks> p;
  JsonArray_TooDeeplyNested_Test *this_local;
  
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8.field_2._8_8_ = 0;
  local_e8._M_dataplus = (_Alloc_hider)0x0;
  local_e8._1_7_ = 0;
  local_e8._M_string_length = 0;
  p.coordinate_ = (coord)this;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_e8);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_c8,(json_out_callbacks *)&local_e8,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,200,'[',
             (allocator *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  this_00 = pstore::json::parser<json_out_callbacks>::input
                      ((parser<json_out_callbacks> *)local_c8,&local_138);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_118,this_00);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  lhs = pstore::json::parser<json_out_callbacks>::last_error((parser<json_out_callbacks> *)local_c8)
  ;
  eVar2 = pstore::json::make_error_code(nesting_too_deep);
  local_160._M_cat = eVar2._M_cat;
  local_160._M_value = eVar2._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_150,"p.last_error ()",
             "make_error_code (json::error_code::nesting_too_deep)",lhs,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xff,message);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_c8);
  return;
}

Assistant:

TEST_F (JsonArray, TooDeeplyNested) {
    json::parser<json_out_callbacks> p;
    p.input (std::string (std::string::size_type{200}, '[')).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::nesting_too_deep));
}